

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_deep_copy(REF_CELL *ref_cell_ptr,REF_CELL original)

{
  uint uVar1;
  int iVar2;
  REF_INT *pRVar3;
  uint uVar4;
  REF_CELL ref_cell;
  REF_INT *pRVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  
  ref_cell = (REF_CELL)malloc(0x48);
  *ref_cell_ptr = ref_cell;
  if (ref_cell == (REF_CELL)0x0) {
    pcVar9 = "malloc *ref_cell_ptr of REF_CELL_STRUCT NULL";
    uVar6 = 0x1e4;
LAB_00134b70:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar6,
           "ref_cell_deep_copy",pcVar9);
    uVar4 = 2;
  }
  else {
    uVar4 = ref_cell_initialize(ref_cell,original->type);
    if (uVar4 == 0) {
      uVar4 = original->max;
      ref_cell->n = original->n;
      ref_cell->max = uVar4;
      uVar1 = ref_cell->size_per;
      if ((int)(uVar1 * uVar4) < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x1ef,"ref_cell_deep_copy","malloc ref_cell->c2n of REF_INT negative");
        return 1;
      }
      pRVar5 = (REF_INT *)malloc((ulong)(uVar1 * uVar4) << 2);
      ref_cell->c2n = pRVar5;
      if (pRVar5 == (REF_INT *)0x0) {
        pcVar9 = "malloc ref_cell->c2n of REF_INT NULL";
        uVar6 = 0x1ef;
        goto LAB_00134b70;
      }
      if (0 < (int)uVar4) {
        lVar7 = 0;
        uVar8 = 0;
        do {
          if (0 < (int)uVar1) {
            iVar2 = original->size_per;
            pRVar3 = original->c2n;
            uVar10 = 0;
            do {
              pRVar5[uVar10] = *(REF_INT *)((long)pRVar3 + uVar10 * 4 + iVar2 * lVar7);
              uVar10 = uVar10 + 1;
            } while (uVar1 != uVar10);
          }
          uVar8 = uVar8 + 1;
          pRVar5 = pRVar5 + (int)uVar1;
          lVar7 = lVar7 + 4;
        } while (uVar8 != uVar4);
      }
      ref_cell->blank = original->blank;
      uVar4 = ref_adj_deep_copy(&ref_cell->ref_adj,original->ref_adj);
      if (uVar4 == 0) {
        return 0;
      }
      pcVar9 = "deep copy ref_adj for ref_cell";
      uVar6 = 0x1f7;
    }
    else {
      pcVar9 = "init";
      uVar6 = 0x1e8;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar6,
           "ref_cell_deep_copy",(ulong)uVar4,pcVar9);
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_cell_deep_copy(REF_CELL *ref_cell_ptr,
                                      REF_CELL original) {
  REF_INT node, cell;
  REF_INT max;
  REF_CELL ref_cell;
  ref_malloc(*ref_cell_ptr, 1, REF_CELL_STRUCT);

  ref_cell = (*ref_cell_ptr);

  RSS(ref_cell_initialize(ref_cell, ref_cell_type(original)), "init");

  max = ref_cell_max(original);
  ref_cell_n(ref_cell) = ref_cell_n(original);
  ref_cell_max(ref_cell) = max;

  ref_malloc(ref_cell->c2n,
             ref_cell_max(ref_cell) * ref_cell_size_per(ref_cell), REF_INT);
  for (cell = 0; cell < max; cell++)
    for (node = 0; node < ref_cell_size_per(ref_cell); node++)
      ref_cell_c2n(ref_cell, node, cell) = ref_cell_c2n(original, node, cell);

  ref_cell_blank(ref_cell) = ref_cell_blank(original);

  RSS(ref_adj_deep_copy(&(ref_cell->ref_adj), original->ref_adj),
      "deep copy ref_adj for ref_cell");

  return REF_SUCCESS;
}